

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

void ON_NurbsSurface::ON_Internal_ConvertToCurve(ON_NurbsSurface *srf,int dir,ON_NurbsCurve *crv)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  ON_Curve::DestroyCurveTree(&crv->super_ON_Curve);
  bVar1 = dir != 0;
  iVar7 = (srf->m_dim + 1) - (uint)(srf->m_is_rat == 0);
  iVar6 = srf->m_cv_count[dir == 0];
  iVar8 = iVar7 * iVar6;
  iVar2 = KnotCount(srf,(uint)bVar1);
  crv->m_dim = iVar8;
  crv->m_is_rat = 0;
  uVar3 = (ulong)((uint)bVar1 * 4);
  crv->m_order = *(int *)((long)srf->m_order + uVar3);
  crv->m_cv_count = *(int *)((long)srf->m_cv_count + uVar3);
  crv->m_cv_stride = iVar8;
  ON_NurbsCurve::ReserveCVCapacity(crv,iVar8 * *(int *)((long)srf->m_cv_count + uVar3));
  iVar8 = KnotCount(srf,(uint)bVar1);
  ON_NurbsCurve::ReserveKnotCapacity(crv,iVar8);
  pdVar4 = srf->m_knot[bVar1];
  if (pdVar4 != (double *)0x0 && crv->m_knot != pdVar4) {
    memcpy(crv->m_knot,pdVar4,(long)iVar2 << 3);
  }
  if (srf->m_cv != (double *)0x0 && crv->m_cv != srf->m_cv) {
    lVar9 = (long)iVar7;
    iVar2 = 0;
    if (iVar6 < 1) {
      iVar6 = iVar2;
    }
    if (dir == 0) {
      for (; iVar2 < crv->m_cv_count; iVar2 = iVar2 + 1) {
        pdVar4 = ON_NurbsCurve::CV(crv,iVar2);
        for (iVar8 = 0; iVar6 != iVar8; iVar8 = iVar8 + 1) {
          pdVar5 = CV(srf,iVar2,iVar8);
          memcpy(pdVar4,pdVar5,lVar9 * 8);
          pdVar4 = pdVar4 + lVar9;
        }
      }
    }
    else {
      for (iVar2 = 0; iVar2 < crv->m_cv_count; iVar2 = iVar2 + 1) {
        pdVar4 = ON_NurbsCurve::CV(crv,iVar2);
        for (iVar8 = 0; iVar6 != iVar8; iVar8 = iVar8 + 1) {
          pdVar5 = CV(srf,iVar8,iVar2);
          memcpy(pdVar4,pdVar5,lVar9 * 8);
          pdVar4 = pdVar4 + lVar9;
        }
      }
    }
  }
  return;
}

Assistant:

void ON_NurbsSurface::ON_Internal_ConvertToCurve(const ON_NurbsSurface& srf,
                                                 int dir, ON_NurbsCurve& crv) {
  crv.DestroyCurveTree();
  if (dir)
    dir = 1;
  const int Sdim = srf.CVSize();
  const int n = srf.CVCount(1-dir);
  const int Ndim = Sdim*n;
  const int knot_count = srf.KnotCount(dir);
  int i, j;
  double *Ncv;
  const double *Scv;

  crv.m_dim = Ndim;
  crv.m_is_rat = 0;
  crv.m_order = srf.Order(dir);
  crv.m_cv_count = srf.CVCount(dir);
  crv.m_cv_stride = crv.m_dim;
  crv.ReserveCVCapacity(srf.CVCount(dir)*Ndim);
  crv.ReserveKnotCapacity(srf.KnotCount(dir));

  if ( crv.m_knot != srf.m_knot[dir] && srf.m_knot[dir] ) 
  {
    memcpy( crv.m_knot, srf.m_knot[dir], knot_count*sizeof(crv.m_knot[0]) );
  }

  if ( crv.m_cv != srf.m_cv && srf.m_cv ) 
  {
    if (dir) {
      for ( i = 0; i < crv.m_cv_count; i++ ) {
        Ncv = crv.CV(i);
        for ( j = 0; j < n; j++ ) {
          Scv = srf.CV(j,i);
          memcpy( Ncv, Scv, Sdim*sizeof(*Ncv) );
          Ncv += Sdim;
        }
      }
    }
    else {
      for ( i = 0; i < crv.m_cv_count; i++ ) {
        Ncv = crv.CV(i);
        for ( j = 0; j < n; j++ ) {
          Scv = srf.CV(i,j);
          memcpy( Ncv, Scv, Sdim*sizeof(*Ncv) );
          Ncv += Sdim;
        }
      }
    }
  }
}